

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

string mjs::anon_unknown_35::get_source_string
                 (gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  bool bVar1;
  global_object *this;
  gc_heap *h_00;
  size_type sVar2;
  const_reference pvVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  string sVar5;
  wstring_view local_90 [2];
  int local_70;
  uint local_6c;
  value_type ch;
  uint32_t l;
  uint32_t i;
  bool escape;
  wstring res;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view s_local;
  
  global_local = (gc_heap_ptr<mjs::global_object> *)s._M_str;
  s_local._M_str = (wchar_t *)global;
  this = gc_heap_ptr<mjs::global_object>::operator->((gc_heap_ptr<mjs::global_object> *)s._M_len);
  h_00 = object::heap(&this->super_object);
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&res.field_2 + 8),
               (anonymous_namespace)::empty_string_regexp);
    string::string((string *)global,h_00,(string_view *)((long)&res.field_2 + 8));
    uVar4 = extraout_RDX;
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&i);
    l._3_1_ = 0;
    ch = 0;
    sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local);
    local_6c = (uint)sVar2;
    for (; (uint)ch < local_6c; ch = ch + 1) {
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                          (ulong)(uint)ch);
      local_70 = *pvVar3;
      if ((l._3_1_ & 1) == 0) {
        if (local_70 == 0x5c) {
          l._3_1_ = 1;
        }
        else if (local_70 == 0x2f) {
          std::__cxx11::wstring::push_back((wchar_t)&i);
        }
      }
      else {
        l._3_1_ = 0;
      }
      std::__cxx11::wstring::push_back((wchar_t)&i);
    }
    local_90[0] = (wstring_view)
                  std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&i);
    string::string((string *)global,h_00,local_90);
    std::__cxx11::wstring::~wstring((wstring *)&i);
    uVar4 = extraout_RDX_00;
  }
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar4;
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)global;
  return (string)sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string get_source_string(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    auto& h = global->heap();

    if (s.empty()) {
        return string{h, empty_string_regexp};
    }

    std::wstring res;
    bool escape = false;
    for (uint32_t i = 0, l = static_cast<uint32_t>(s.length()); i < l; ++i) {
        const auto ch = s[i];
        if (escape) {
            escape = false;
        } else if (ch == '\\') {
            escape = true;
        } else if (ch == '/') {
            res.push_back('\\');
        }
        res.push_back(ch);
    }

    return string{h, res};
}